

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote.cpp
# Opt level: O0

MapModuleMemoryRegion * __thiscall remote::Handle::GetRegionOfAddress(Handle *this,void *address)

{
  unsigned_long uVar1;
  size_type sVar2;
  reference pvVar3;
  ulong local_28;
  size_t i;
  void *address_local;
  Handle *this_local;
  
  local_28 = 0;
  do {
    sVar2 = std::
            vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
            size(&this->regions);
    if (sVar2 <= local_28) {
      return (MapModuleMemoryRegion *)0x0;
    }
    pvVar3 = std::
             vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>::
             operator[](&this->regions,local_28);
    if (address < (void *)pvVar3->start) {
      pvVar3 = std::
               vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
               ::operator[](&this->regions,local_28);
      uVar1 = pvVar3->start;
      pvVar3 = std::
               vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
               ::operator[](&this->regions,local_28);
      if ((void *)(uVar1 + pvVar3->end) <= address) {
        pvVar3 = std::
                 vector<remote::MapModuleMemoryRegion,_std::allocator<remote::MapModuleMemoryRegion>_>
                 ::operator[](&this->regions,local_28);
        return pvVar3;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

MapModuleMemoryRegion* Handle::GetRegionOfAddress(void* address) {
        for(size_t i = 0; i < regions.size(); i++) {
            if(regions[i].start > (unsigned long) address && (regions[i].start + regions[i].end) <= (unsigned long) address) {
                return &regions[i];
            }
        }

        return NULL;
    }